

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cs::
allocator_type<cs_impl::any::holder<std::__cxx11::string>,64ul,cs_impl::default_allocator_provider>
::alloc<char*&>(allocator_type<cs_impl::any::holder<std::__cxx11::string>,64ul,cs_impl::default_allocator_provider>
                *this,char **args)

{
  long lVar1;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x28);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<std::__cxx11::string>::holder<char*&>
            ((holder<std::__cxx11::string> *)this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}